

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

void icu_63::ICU_Utility::appendToRule
               (UnicodeString *rule,UnicodeString *text,UBool isLiteral,UBool escapeUnprintable,
               UnicodeString *quoteBuf)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  char16_t *pcVar4;
  long lVar5;
  
  sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
  uVar2 = (uint)sVar1;
  if (sVar1 < 0) {
    iVar3 = (text->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)uVar2 >> 5;
  }
  if (0 < iVar3) {
    lVar5 = 0;
    do {
      pcVar4 = (char16_t *)((long)&text->fUnion + 2);
      if ((uVar2 & 2) == 0) {
        pcVar4 = (text->fUnion).fFields.fArray;
      }
      appendToRule(rule,(uint)(ushort)pcVar4[lVar5],isLiteral,escapeUnprintable,quoteBuf);
      sVar1 = (text->fUnion).fStackFields.fLengthAndFlags;
      uVar2 = (uint)sVar1;
      if (sVar1 < 0) {
        iVar3 = (text->fUnion).fFields.fLength;
      }
      else {
        iVar3 = (int)uVar2 >> 5;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 < iVar3);
  }
  return;
}

Assistant:

void ICU_Utility::appendToRule(UnicodeString& rule,
                               const UnicodeString& text,
                               UBool isLiteral,
                               UBool escapeUnprintable,
                               UnicodeString& quoteBuf) {
    for (int32_t i=0; i<text.length(); ++i) {
        appendToRule(rule, text[i], isLiteral, escapeUnprintable, quoteBuf);
    }
}